

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tld.c
# Opt level: O3

int faup_tld_download_mozilla_list(char *store_to_file)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  char *newenviron [1];
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  undefined8 local_28;
  
  local_40 = "https://publicsuffix.org/list/public_suffix_list.dat";
  local_38 = "--output";
  iVar3 = 0;
  local_28 = 0;
  local_50 = (char *)0x0;
  local_30 = store_to_file;
  fprintf(_stdout,"Downloading new TLD list to %s\n",store_to_file);
  pcVar2 = getenv("FAUP_DOWNLOAD_PROGRAM");
  local_48 = "/usr/bin/curl";
  if (pcVar2 != (char *)0x0) {
    local_48 = pcVar2;
  }
  iVar1 = execve(local_48,&local_48,&local_50);
  if (iVar1 == -1) {
    faup_tld_download_mozilla_list_cold_1();
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int faup_tld_download_mozilla_list(char *store_to_file) 
{
	char *download_program;
	char *newargv[] = { NULL, MOZILLA_TLD_LIST_URL, "--output", store_to_file, NULL };
	char *newenviron[] = { NULL };
	int retval = -1;
	
	fprintf(stdout, "Downloading new TLD list to %s\n", store_to_file);

	download_program = getenv("FAUP_DOWNLOAD_PROGRAM");
	if (!download_program) {
		newargv[0] = "/usr/bin/curl";
	} else {
		newargv[0] = download_program;
	}

	if (!newargv[0]) {
		return -1;
	}
	retval = execve(newargv[0], newargv, newenviron);
	if (retval == -1) {
		fprintf(stderr, "execve on %s failed. Reason: %s\n", newargv[0], strerror(errno));
		return -1;
	}

	return 0;
}